

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

SimpleDFS * dg::vr::VRCodeGraph::dfs_end(void)

{
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit> *in_RDI;
  
  memset(in_RDI,0,0x58);
  DFSIt<dg::vr::VRCodeGraph::SimpleVisit>::DFSIt(in_RDI);
  return in_RDI;
}

Assistant:

VRCodeGraph::SimpleDFS VRCodeGraph::dfs_end() { return SimpleDFS(); }